

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLEventsSourceTests.cpp
# Opt level: O1

void __thiscall
solitaire::events::SDLEventsSourceTests_returnMouseLeftButtonUpEvent_Test::
~SDLEventsSourceTests_returnMouseLeftButtonUpEvent_Test
          (SDLEventsSourceTests_returnMouseLeftButtonUpEvent_Test *this)

{
  Wrapper *pWVar1;
  WrapperMock *pWVar2;
  
  (this->super_SDLEventsSourceTests).super_Test._vptr_Test =
       (_func_int **)&PTR__SDLEventsSourceTests_0032a060;
  (this->super_SDLEventsSourceTests).eventsSource.super_EventsSource._vptr_EventsSource =
       (_func_int **)&PTR__SDLEventsSource_00333830;
  pWVar1 = (this->super_SDLEventsSourceTests).eventsSource.sdl._M_t.
           super___uniq_ptr_impl<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::SDL::interfaces::Wrapper_*,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
           .super__Head_base<0UL,_solitaire::SDL::interfaces::Wrapper_*,_false>._M_head_impl;
  if (pWVar1 != (Wrapper *)0x0) {
    (*pWVar1->_vptr_Wrapper[1])();
  }
  (this->super_SDLEventsSourceTests).eventsSource.sdl._M_t.
  super___uniq_ptr_impl<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::SDL::interfaces::Wrapper_*,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
  .super__Head_base<0UL,_solitaire::SDL::interfaces::Wrapper_*,_false>._M_head_impl = (Wrapper *)0x0
  ;
  if (((this->super_SDLEventsSourceTests).sdlMock.isUniquePointerCreated == false) &&
     (pWVar2 = (this->super_SDLEventsSourceTests).sdlMock.rawPointer, pWVar2 != (WrapperMock *)0x0))
  {
    (*(pWVar2->super_Wrapper)._vptr_Wrapper[1])();
  }
  testing::InSequence::~InSequence(&(this->super_SDLEventsSourceTests).seq);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x70);
  return;
}

Assistant:

TEST_F(SDLEventsSourceTests, returnMouseLeftButtonUpEvent) {
    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_MOUSEBUTTONUP;
        event.button.button = SDL_BUTTON_LEFT;
        event.button.x = x;
        event.button.y = y;
        return 1;
    }));

    EXPECT_EQ(std::get<MouseLeftButtonUp>(eventsSource.getEvent()), MouseLeftButtonUp {});
}